

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::addRowsInterface
          (Highs *this,HighsInt ext_num_new_row,double *ext_row_lower,double *ext_row_upper,
          HighsInt ext_num_new_nz,HighsInt *ext_ar_start,HighsInt *ext_ar_index,double *ext_ar_value
          )

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  double in_stack_00000008;
  double *in_stack_00000010;
  HighsInt iRow_1;
  HighsSparseMatrix local_ar_matrix;
  HighsInt iRow;
  double bound_scale_value;
  vector<double,_std::allocator<double>_> local_rowUpper;
  vector<double,_std::allocator<double>_> local_rowLower;
  HighsIndexCollection index_collection;
  HighsInt newNumRow;
  bool *lp_has_scaling;
  bool *useful_basis;
  HighsScale *scale;
  HighsBasis *basis;
  HighsLp *lp;
  HighsOptions *options;
  HighsStatus return_status;
  HighsLogOptions *in_stack_fffffffffffffaf8;
  HighsLp *lp_00;
  Highs *in_stack_fffffffffffffb00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb08;
  allocator *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb20;
  vector<double,_std::allocator<double>_> *this_00;
  HighsStatus in_stack_fffffffffffffb28;
  HighsStatus in_stack_fffffffffffffb2c;
  HighsLp *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  HighsStatus in_stack_fffffffffffffb3c;
  Highs *in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  allocator *paVar4;
  HighsLogOptions *in_stack_fffffffffffffb50;
  HighsLogOptions *log_options;
  double *in_stack_fffffffffffffb60;
  double *in_stack_fffffffffffffb68;
  HighsInt max_scale_factor_exponent;
  HighsSparseMatrix *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  int iVar5;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb80;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb88;
  string *matrix_name;
  HighsIndexCollection *in_stack_fffffffffffffb90;
  HighsLogOptions *log_options_00;
  undefined8 in_stack_fffffffffffffb98;
  HighsInt HVar6;
  HighsSparseMatrix *this_01;
  double *in_stack_fffffffffffffba0;
  HighsOptions *in_stack_fffffffffffffba8;
  HighsLogOptions *in_stack_fffffffffffffbb0;
  HighsLp *in_stack_fffffffffffffbc0;
  HighsLp *in_stack_fffffffffffffbc8;
  HighsLp *in_stack_fffffffffffffbd0;
  double *in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  HighsInt *in_stack_fffffffffffffbf8;
  HighsLogOptions *in_stack_fffffffffffffc00;
  allocator local_3c9;
  string local_3c8 [36];
  int local_3a4;
  int8_t *in_stack_fffffffffffffc90;
  HighsSparseMatrix *in_stack_fffffffffffffc98;
  HighsSparseMatrix *in_stack_fffffffffffffca0;
  undefined1 local_329 [40];
  allocator local_301;
  string local_300 [135];
  undefined1 local_279 [32];
  undefined1 local_259 [61];
  int local_21c;
  undefined4 local_218;
  vector<int,_std::allocator<int>_> local_210 [4];
  int local_1ac;
  HighsLp *local_1a8;
  undefined4 local_1a0;
  allocator local_199;
  string local_198 [136];
  vector<double,_std::allocator<double>_> local_110 [2];
  vector<double,_std::allocator<double>_> local_e0;
  int local_c8;
  undefined1 local_c4;
  undefined4 local_c0;
  int local_bc;
  int local_74;
  byte *local_70;
  byte *local_68;
  long local_60;
  long local_58;
  int *local_50;
  long local_48;
  HighsStatus local_3c;
  int local_2c;
  int local_14;
  HighsStatus local_4;
  
  HVar6 = (HighsInt)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  local_3c = 0;
  local_48 = in_RDI + 0xaa8;
  if (in_ESI < 0) {
    return kError;
  }
  if (in_R8D < 0) {
    return kError;
  }
  if (in_ESI == 0) {
    return kOk;
  }
  local_2c = in_R8D;
  local_14 = in_ESI;
  if ((0 < in_ESI) &&
     (bVar1 = isRowDataNull(in_stack_fffffffffffffbb0,(double *)in_stack_fffffffffffffba8,
                            in_stack_fffffffffffffba0), bVar1)) {
    return kError;
  }
  if ((0 < local_2c) &&
     (bVar1 = isMatrixDataNull(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                               (HighsInt *)
                               CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                               in_stack_fffffffffffffbe8), bVar1)) {
    return kError;
  }
  local_50 = (int *)(in_RDI + 0x138);
  local_58 = in_RDI + 0x70;
  local_60 = in_RDI + 0x340;
  local_68 = (byte *)(in_RDI + 0x72);
  local_70 = (byte *)(in_RDI + 0x344);
  if ((*local_50 < 1) && (0 < local_2c)) {
    return kError;
  }
  local_74 = *(int *)(in_RDI + 0x13c) + local_14;
  HighsIndexCollection::HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffb00);
  local_c8 = local_14;
  local_c4 = 1;
  local_c0 = 0;
  local_bc = local_14 + -1;
  std::allocator<double>::allocator((allocator<double> *)0x4d95f4);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb40,
             (double *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
             (double *)in_stack_fffffffffffffb30,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
  std::allocator<double>::~allocator((allocator<double> *)0x4d9628);
  std::allocator<double>::allocator((allocator<double> *)0x4d9661);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb40,
             (double *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
             (double *)in_stack_fffffffffffffb30,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
  std::allocator<double>::~allocator((allocator<double> *)0x4d9695);
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  lp_00 = (HighsLp *)0x0;
  assessBounds(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0,HVar6,
               in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
               (double)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
               (HighsVarType *)in_stack_fffffffffffffbc0);
  paVar4 = &local_199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"assessBounds",paVar4);
  local_3c = interpretCallStatus(in_stack_fffffffffffffb50,
                                 (HighsStatus)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                                 (HighsStatus)in_stack_fffffffffffffb48,
                                 (string *)in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4d97a7);
  if (local_3c == kError) {
    local_4 = local_3c;
    local_1a0 = 1;
    goto LAB_004da210;
  }
  if (local_50[0x80] != 0) {
    bVar1 = boundScaleOk((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                         (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb10,
                         (HighsInt)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                         (double)in_stack_fffffffffffffb00);
    if (!bVar1) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "User bound scaling yields infinite bound\n");
      local_4 = kError;
      local_1a0 = 1;
      goto LAB_004da210;
    }
    in_stack_fffffffffffffbd0 = (HighsLp *)std::pow<int,int>(0,0x4d9959);
    local_1a8 = in_stack_fffffffffffffbd0;
    for (local_1ac = 0; local_1ac < local_14; local_1ac = local_1ac + 1) {
      in_stack_fffffffffffffbc0 = local_1a8;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_e0,(long)local_1ac);
      *pvVar2 = (double)in_stack_fffffffffffffbc0 * *pvVar2;
      in_stack_fffffffffffffbc8 = local_1a8;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_110,(long)local_1ac);
      *pvVar2 = (double)in_stack_fffffffffffffbc8 * *pvVar2;
    }
  }
  appendRowsToLpVectors
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  HighsSparseMatrix::HighsSparseMatrix((HighsSparseMatrix *)in_stack_fffffffffffffb30);
  local_21c = *local_50;
  local_218 = local_14;
  local_259._57_4_ = 2;
  if (local_2c == 0) {
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb00,(size_type)lp_00,
               (value_type_conflict2 *)0x4d9f3e);
LAB_004d9f42:
    this_00 = (vector<double,_std::allocator<double>_> *)(local_50 + 0x20);
    HighsSparseMatrix::HighsSparseMatrix
              ((HighsSparseMatrix *)in_stack_fffffffffffffb30,
               (HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    HighsSparseMatrix::addRows
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_stack_fffffffffffffb00);
    HVar6 = (HighsInt)((ulong)in_stack_fffffffffffffbc0 >> 0x20);
    if ((*local_70 & 1) != 0) {
      std::vector<double,_std::allocator<double>_>::resize
                (this_00,CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      local_3a4 = 0;
      while( true ) {
        HVar6 = (HighsInt)((ulong)in_stack_fffffffffffffbc0 >> 0x20);
        max_scale_factor_exponent = (HighsInt)((ulong)in_stack_fffffffffffffb68 >> 0x20);
        if (local_14 <= local_3a4) break;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_60 + 0x30),
                            (long)(local_50[1] + local_3a4));
        *pvVar2 = 1.0;
        local_3a4 = local_3a4 + 1;
      }
      *(int *)(local_60 + 0xc) = local_74;
      HighsSparseMatrix::applyColScale
                ((HighsSparseMatrix *)in_stack_fffffffffffffb40,
                 (HighsScale *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(local_60 + 0x30),(long)local_50[1]);
      HighsSparseMatrix::considerRowScaling
                (in_stack_fffffffffffffb70,max_scale_factor_exponent,in_stack_fffffffffffffb60);
    }
    if ((*local_68 & 1) != 0) {
      appendBasicRowsToBasisInterface(in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
    }
    in_stack_fffffffffffffb10 = &local_3c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c8,"",in_stack_fffffffffffffb10);
    HighsLp::addRowNames(in_stack_fffffffffffffbd0,(string *)in_stack_fffffffffffffbc8,HVar6);
    std::__cxx11::string::~string(local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    local_50[1] = local_50[1] + local_14;
    invalidateModelStatusSolutionAndInfo(in_stack_fffffffffffffb00);
    HEkk::addRows((HEkk *)in_stack_fffffffffffffb00,lp_00,(HighsSparseMatrix *)0x4da18f);
  }
  else {
    std::allocator<int>::allocator((allocator<int> *)0x4d9ac3);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb40,
               (int *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               &in_stack_fffffffffffffb30->num_col_,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    this_01 = (HighsSparseMatrix *)(local_259 + 0x21);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb10,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb08);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb10);
    std::allocator<int>::~allocator((allocator<int> *)0x4d9b29);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20,
               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    iVar5 = local_2c;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_210,(long)local_14);
    *pvVar3 = iVar5;
    matrix_name = (string *)((long)in_stack_00000008 + (long)local_2c * 4);
    log_options_00 = (HighsLogOptions *)local_259;
    std::allocator<int>::allocator((allocator<int> *)0x4d9ba9);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb40,
               (int *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               &in_stack_fffffffffffffb30->num_col_,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb10,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb08);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb10);
    std::allocator<int>::~allocator((allocator<int> *)0x4d9c01);
    in_stack_fffffffffffffb68 = in_stack_00000010 + local_2c;
    in_stack_fffffffffffffb70 = (HighsSparseMatrix *)local_279;
    std::allocator<double>::allocator((allocator<double> *)0x4d9c31);
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb40,
               (double *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               (double *)in_stack_fffffffffffffb30,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    log_options = (HighsLogOptions *)(local_279 + 1);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb10,
               in_stack_fffffffffffffb08);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb10);
    std::allocator<double>::~allocator((allocator<double> *)0x4d9c80);
    HighsLogOptions::HighsLogOptions
              ((HighsLogOptions *)in_stack_fffffffffffffb00,(HighsLogOptions *)lp_00);
    in_stack_fffffffffffffb40 = (Highs *)(local_48 + 0x380);
    paVar4 = &local_301;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_300,"LP",paVar4);
    in_stack_fffffffffffffb3c =
         HighsSparseMatrix::assess
                   (this_01,log_options_00,matrix_name,in_stack_00000008,
                    (double)CONCAT44(iVar5,in_stack_fffffffffffffb78));
    in_stack_fffffffffffffb30 = (HighsLp *)local_329;
    in_stack_fffffffffffffb2c = local_3c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_329 + 1),"assessMatrix",(allocator *)in_stack_fffffffffffffb30);
    in_stack_fffffffffffffb28 =
         interpretCallStatus(log_options,(HighsStatus)((ulong)paVar4 >> 0x20),(HighsStatus)paVar4,
                             (string *)in_stack_fffffffffffffb40);
    local_3c = in_stack_fffffffffffffb28;
    std::__cxx11::string::~string((string *)(local_329 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_329);
    std::__cxx11::string::~string(local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4d9dbd);
    in_stack_fffffffffffffb60 = in_stack_00000010;
    if (local_3c != kError) goto LAB_004d9f42;
  }
  local_1a0 = 1;
  local_4 = local_3c;
  HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_stack_fffffffffffffb00);
LAB_004da210:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb10);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb10);
  HighsIndexCollection::~HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffb00);
  return local_4;
}

Assistant:

HighsStatus Highs::addRowsInterface(HighsInt ext_num_new_row,
                                    const double* ext_row_lower,
                                    const double* ext_row_upper,
                                    HighsInt ext_num_new_nz,
                                    const HighsInt* ext_ar_start,
                                    const HighsInt* ext_ar_index,
                                    const double* ext_ar_value) {
  // addRows is fundamentally different from addCols, since the new
  // matrix data are held row-wise, so we have to insert data into the
  // column-wise matrix of the LP.
  if (kExtendInvertWhenAddingRows) {
    if (ekk_instance_.status_.has_nla)
      ekk_instance_.debugNlaCheckInvert("Start of Highs::addRowsInterface",
                                        kHighsDebugLevelExpensive + 1);
  }
  HighsStatus return_status = HighsStatus::kOk;
  HighsOptions& options = options_;
  if (ext_num_new_row < 0) return HighsStatus::kError;
  if (ext_num_new_nz < 0) return HighsStatus::kError;
  if (ext_num_new_row == 0) return HighsStatus::kOk;
  if (ext_num_new_row > 0)
    if (isRowDataNull(options.log_options, ext_row_lower, ext_row_upper))
      return HighsStatus::kError;
  if (ext_num_new_nz > 0)
    if (isMatrixDataNull(options.log_options, ext_ar_start, ext_ar_index,
                         ext_ar_value))
      return HighsStatus::kError;

  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  HighsScale& scale = lp.scale_;
  bool& useful_basis = basis.useful;

  bool& lp_has_scaling = lp.scale_.has_scaling;

  // Check that if nonzeros are to be added then the model has a positive number
  // of columns
  if (lp.num_col_ <= 0 && ext_num_new_nz > 0) return HighsStatus::kError;

  // Record the new number of rows
  HighsInt newNumRow = lp.num_row_ + ext_num_new_row;

  HighsIndexCollection index_collection;
  index_collection.dimension_ = ext_num_new_row;
  index_collection.is_interval_ = true;
  index_collection.from_ = 0;
  index_collection.to_ = ext_num_new_row - 1;
  // Take a copy of the bounds that can be normalised
  std::vector<double> local_rowLower{ext_row_lower,
                                     ext_row_lower + ext_num_new_row};
  std::vector<double> local_rowUpper{ext_row_upper,
                                     ext_row_upper + ext_num_new_row};

  return_status = interpretCallStatus(
      options_.log_options,
      assessBounds(options, "Row", lp.num_row_, index_collection,
                   local_rowLower, local_rowUpper, options.infinite_bound),
      return_status, "assessBounds");
  if (return_status == HighsStatus::kError) return return_status;
  if (lp.user_bound_scale_) {
    // Assess and apply any user bound scaling
    if (!boundScaleOk(local_rowLower, local_rowUpper, lp.user_bound_scale_,
                      options_.infinite_bound)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User bound scaling yields infinite bound\n");
      return HighsStatus::kError;
    }
    double bound_scale_value = std::pow(2, lp.user_bound_scale_);
    for (HighsInt iRow = 0; iRow < ext_num_new_row; iRow++) {
      local_rowLower[iRow] *= bound_scale_value;
      local_rowUpper[iRow] *= bound_scale_value;
    }
  }

  // Append the rows to the LP vectors
  appendRowsToLpVectors(lp, ext_num_new_row, local_rowLower, local_rowUpper);

  // Form a row-wise HighsSparseMatrix of the new matrix rows so that
  // is easy to handle and, if there are nonzeros, it can be
  // normalised
  HighsSparseMatrix local_ar_matrix;
  local_ar_matrix.num_col_ = lp.num_col_;
  local_ar_matrix.num_row_ = ext_num_new_row;
  local_ar_matrix.format_ = MatrixFormat::kRowwise;
  if (ext_num_new_nz) {
    local_ar_matrix.start_ = {ext_ar_start, ext_ar_start + ext_num_new_row};
    local_ar_matrix.start_.resize(ext_num_new_row + 1);
    local_ar_matrix.start_[ext_num_new_row] = ext_num_new_nz;
    local_ar_matrix.index_ = {ext_ar_index, ext_ar_index + ext_num_new_nz};
    local_ar_matrix.value_ = {ext_ar_value, ext_ar_value + ext_num_new_nz};
    // Assess the matrix columns
    return_status =
        interpretCallStatus(options_.log_options,
                            local_ar_matrix.assess(options.log_options, "LP",
                                                   options.small_matrix_value,
                                                   options.large_matrix_value),
                            return_status, "assessMatrix");
    if (return_status == HighsStatus::kError) return return_status;
  } else {
    // No nonzeros so, whether the constraint matrix is row-wise or
    // column-wise, adding the empty matrix is trivial. Complete the
    // setup of an empty row-wise HighsSparseMatrix of the new matrix
    // rows
    local_ar_matrix.start_.assign(ext_num_new_row + 1, 0);
  }
  // Append the rows to LP matrix
  lp.a_matrix_.addRows(local_ar_matrix);
  if (lp_has_scaling) {
    // Extend the row scaling factors
    scale.row.resize(newNumRow);
    for (HighsInt iRow = 0; iRow < ext_num_new_row; iRow++)
      scale.row[lp.num_row_ + iRow] = 1.0;
    scale.num_row = newNumRow;
    // Apply the existing column scaling to the new rows
    local_ar_matrix.applyColScale(scale);
    // Consider applying row scaling to the new rows.
    local_ar_matrix.considerRowScaling(options.allowed_matrix_scale_factor,
                                       &scale.row[lp.num_row_]);
  }
  // Update the basis corresponding to new basic rows
  if (useful_basis) appendBasicRowsToBasisInterface(ext_num_new_row);

  // Possibly add row names
  lp.addRowNames("", ext_num_new_row);

  // Increase the number of rows in the LP
  lp.num_row_ += ext_num_new_row;
  assert(lpDimensionsOk("addRows", lp, options.log_options));

  // Deduce the consequences of adding new rows
  invalidateModelStatusSolutionAndInfo();
  // Determine any implications for simplex data
  ekk_instance_.addRows(lp, local_ar_matrix);

  return return_status;
}